

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O0

_Bool blobtrans_read(BlobTransformer *bt,BinarySource *src,blob_fmt blob)

{
  uint uVar1;
  size_t sVar2;
  _Bool _Var3;
  ptrlen *ppVar4;
  uint *puVar5;
  ptrlen pVar6;
  void *local_70;
  ptrlen part;
  size_t j;
  size_t i_1;
  size_t local_48;
  ulong local_40;
  size_t i;
  size_t nparts;
  BinarySource *src_local;
  BlobTransformer *bt_local;
  blob_fmt blob_local;
  
  puVar5 = blob.fmt;
  i = bt->nparts;
  for (local_40 = 0; local_40 < blob.len; local_40 = local_40 + 1) {
    if (i < puVar5[local_40] + 1) {
      i = (size_t)(puVar5[local_40] + 1);
    }
  }
  if (bt->nparts < i) {
    ppVar4 = (ptrlen *)saferealloc(bt->parts,i,0x10);
    bt->parts = ppVar4;
    while (bt->nparts < i) {
      ppVar4 = bt->parts;
      sVar2 = bt->nparts;
      bt->nparts = sVar2 + 1;
      pVar6 = make_ptrlen((void *)0x0,0);
      i_1 = (size_t)pVar6.ptr;
      ppVar4[sVar2].ptr = (void *)i_1;
      local_48 = pVar6.len;
      ppVar4[sVar2].len = local_48;
    }
  }
  j = 0;
  while( true ) {
    if (blob.len <= j) {
      return true;
    }
    uVar1 = puVar5[j];
    pVar6 = BinarySource_get_string(src->binarysource_);
    if ((bt->parts[uVar1].ptr != (void *)0x0) &&
       (_Var3 = ptrlen_eq_ptrlen(bt->parts[uVar1],pVar6), !_Var3)) break;
    ppVar4 = bt->parts;
    local_70 = pVar6.ptr;
    ppVar4[uVar1].ptr = local_70;
    part.ptr = (void *)pVar6.len;
    ppVar4[uVar1].len = (size_t)part.ptr;
    j = j + 1;
  }
  return false;
}

Assistant:

static inline bool blobtrans_read(BlobTransformer *bt, BinarySource *src,
                                  blob_fmt blob)
{
    size_t nparts = bt->nparts;
    for (size_t i = 0; i < blob.len; i++)
        if (nparts < blob.fmt[i]+1)
            nparts = blob.fmt[i]+1;

    if (nparts > bt->nparts) {
        bt->parts = sresize(bt->parts, nparts, ptrlen);
        while (bt->nparts < nparts)
            bt->parts[bt->nparts++] = make_ptrlen(NULL, 0);
    }

    for (size_t i = 0; i < blob.len; i++) {
        size_t j = blob.fmt[i];
        ptrlen part = get_string(src);
        if (bt->parts[j].ptr) {
            /*
             * If the same string appears in both the public blob and
             * the private data, check they match. (This happens in
             * Ed25519: an extra copy of the public point string
             * appears in the certified OpenSSH data after the
             * certificate and before the private key.)
             */
            if (!ptrlen_eq_ptrlen(bt->parts[j], part))
                return false;
        }
        bt->parts[j] = part;
    }

    return true;
}